

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFGdbIndex.cpp
# Opt level: O2

void __thiscall llvm::DWARFGdbIndex::dumpTUList(DWARFGdbIndex *this,raw_ostream *OS)

{
  long lVar1;
  int iVar2;
  TypeUnitEntry *TU;
  unsigned_long *Vals_1;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>_>
  local_b8;
  ulong local_38;
  
  local_38 = (ulong)(this->TuList).super_SmallVectorImpl<llvm::DWARFGdbIndex::TypeUnitEntry>.
                    super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::TypeUnitEntry,_true>.
                    super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void>.
                    super_SmallVectorBase.Size;
  formatv<const_unsigned_int_&,_unsigned_long>
            ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_long>_>_>
              *)&local_b8,"\n  Types CU list offset = {0:x}, has {1} entries:\n",&this->TuListOffset
             ,&local_38);
  raw_ostream::operator<<(OS,&local_b8.super_formatv_object_base);
  formatv_object_base::~formatv_object_base(&local_b8.super_formatv_object_base);
  Vals_1 = (unsigned_long *)
           (this->TuList).super_SmallVectorImpl<llvm::DWARFGdbIndex::TypeUnitEntry>.
           super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::TypeUnitEntry,_true>.
           super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void>.
           super_SmallVectorBase.BeginX;
  iVar2 = 0;
  for (lVar1 = (ulong)(this->TuList).super_SmallVectorImpl<llvm::DWARFGdbIndex::TypeUnitEntry>.
                      super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::TypeUnitEntry,_true>.
                      super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void>.
                      super_SmallVectorBase.Size * 0x18; lVar1 != 0; lVar1 = lVar1 + -0x18) {
    local_38 = CONCAT44(local_38._4_4_,iVar2);
    formatv<unsigned_int,_const_unsigned_long_&,_const_unsigned_long_&,_const_unsigned_long_&>
              (&local_b8,
               "    {0}: offset = {1:x8}, type_offset = {2:x8}, type_signature = {3:x16}\n",
               (uint *)&local_38,Vals_1,Vals_1 + 1,Vals_1 + 2);
    raw_ostream::operator<<(OS,&local_b8.super_formatv_object_base);
    iVar2 = iVar2 + 1;
    formatv_object_base::~formatv_object_base(&local_b8.super_formatv_object_base);
    Vals_1 = Vals_1 + 3;
  }
  return;
}

Assistant:

void DWARFGdbIndex::dumpTUList(raw_ostream &OS) const {
  OS << formatv("\n  Types CU list offset = {0:x}, has {1} entries:\n",
                TuListOffset, TuList.size());
  uint32_t I = 0;
  for (const TypeUnitEntry &TU : TuList)
    OS << formatv("    {0}: offset = {1:x8}, type_offset = {2:x8}, "
                  "type_signature = {3:x16}\n",
                  I++, TU.Offset, TU.TypeOffset, TU.TypeSignature);
}